

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void __thiscall duckdb::Vector::Flatten(Vector *this,idx_t count)

{
  ValidityMask *this_00;
  buffer_ptr<ValidityBuffer> *this_01;
  PhysicalType PVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  int64_t *piVar4;
  int64_t start;
  int64_t increment;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  unsigned_long *puVar6;
  byte *pbVar7;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var8;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var9;
  pointer puVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  byte bVar16;
  VectorBuffer *pVVar17;
  unsigned_long count_00;
  idx_t iVar18;
  idx_t iVar19;
  type pVVar20;
  Vector *pVVar21;
  pointer pVVar22;
  pointer pVVar23;
  type pVVar24;
  TemplatedValidityData<unsigned_long> *pTVar25;
  unsigned_long uVar26;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar27;
  InternalException *pIVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  idx_t iVar32;
  _Head_base<0UL,_duckdb::VectorArrayBuffer_*,_false> _Var33;
  data_ptr_t pdVar34;
  idx_t idx;
  _Head_base<0UL,_unsigned_long_*,_false> __s;
  ulong uVar35;
  pointer this_02;
  bool bVar36;
  int iVar43;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar86;
  int iVar87;
  int iVar92;
  undefined1 auVar88 [16];
  int iVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM11 [16];
  undefined1 in_XMM12 [16];
  Vector other;
  idx_t local_130;
  type local_128;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_120;
  undefined1 local_118 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_110 [2];
  _Head_base<0UL,_duckdb::VectorArrayBuffer_*,_false> local_100;
  undefined1 local_f8 [8];
  LogicalType aLStack_f0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  shared_ptr<duckdb::VectorBuffer,_true> local_88;
  Vector *local_70;
  idx_t local_68;
  LogicalType local_60;
  LogicalType local_48;
  
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118;
  local_130 = count;
  switch(this->vector_type) {
  case FLAT_VECTOR:
    break;
  case FSST_VECTOR:
    iVar18 = FSSTVector::GetCount(this);
    LogicalType::LogicalType(&local_48,&this->type);
    Vector((Vector *)local_f8,&local_48,iVar18);
    LogicalType::~LogicalType(&local_48);
    VectorOperations::Copy(this,(Vector *)local_f8,iVar18,0,0);
    Reference(this,(Vector *)local_f8);
    goto LAB_00da38f9;
  case CONSTANT_VECTOR:
    puVar6 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar6 == (unsigned_long *)0x0) {
      bVar36 = false;
    }
    else {
      bVar36 = (*puVar6 & 1) == 0;
    }
    local_88.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    pbVar7 = this->data;
    iVar19 = GetTypeIdSize((this->type).physical_type_);
    iVar18 = 0x800;
    if (0x800 < count) {
      iVar18 = count;
    }
    local_118 = (undefined1  [8])(iVar19 * iVar18);
    make_buffer<duckdb::VectorBuffer,unsigned_long>((duckdb *)local_f8,(unsigned_long *)local_118);
    auVar14 = local_f8;
    uVar11 = aLStack_f0[0]._0_8_;
    _local_f8 = (undefined1  [16])0x0;
    p_Var5 = (this->buffer).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)auVar14;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_);
      }
    }
    if (local_88.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
      pVVar20 = shared_ptr<duckdb::VectorBuffer,_true>::operator*(&local_88);
      _Var8._M_head_impl =
           (pVVar20->aux_data).
           super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
      (pVVar20->aux_data).
      super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl =
           (VectorAuxiliaryData *)0x0;
      _Var9._M_head_impl =
           (pVVar17->aux_data).
           super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
      (pVVar17->aux_data).
      super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
      .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl = _Var8._M_head_impl
      ;
      if (_Var9._M_head_impl != (VectorAuxiliaryData *)0x0) {
        (**(code **)((long)(_Var9._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
      }
    }
    pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    this_00 = &this->validity;
    pdVar34 = (pVVar17->data).pointer;
    this->data = pdVar34;
    this->vector_type = FLAT_VECTOR;
    auVar13 = _DAT_01d84390;
    PVar1 = (this->type).physical_type_;
    if (bVar36) {
      if (PVar1 == ARRAY) {
switchD_00da3c4b_caseD_1d:
        pVVar21 = ArrayVector::GetEntryInternal<duckdb::Vector>(this);
        iVar18 = ArrayType::GetSize(&this->type);
        make_uniq<duckdb::VectorArrayBuffer,duckdb::LogicalType_const&,unsigned_long&>
                  ((duckdb *)&local_100,&this->type,&local_130);
        pVVar22 = unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>
                  ::operator->((unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>
                                *)&local_100);
        local_128 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (&pVVar22->child);
        if (bVar36) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    (&this_00->super_TemplatedValidityMask<unsigned_long>,local_130);
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    (&(local_128->validity).super_TemplatedValidityMask<unsigned_long>,
                     local_130 * iVar18);
          Flatten(local_128,local_130 * iVar18);
        }
        make_uniq<duckdb::Vector,duckdb::Vector&>((duckdb *)&local_120,pVVar21);
        pVVar23 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                              *)&local_120);
        Flatten(pVVar23,local_130 * iVar18);
        local_70 = this;
        SelectionVector::SelectionVector((SelectionVector *)local_f8,local_130 * iVar18);
        if (local_130 != 0) {
          iVar32 = 0;
          uVar30 = 0;
          uVar31 = local_130;
          iVar19 = iVar18;
          local_68 = iVar18;
          do {
            iVar18 = iVar19;
            if (iVar19 != 0) {
              uVar35 = 0;
              idx = iVar32;
              do {
                pVVar24 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                          operator*((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                                     *)&local_120);
                puVar6 = (pVVar24->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask;
                if ((puVar6 != (unsigned_long *)0x0) &&
                   ((puVar6[uVar35 >> 6] >> (uVar35 & 0x3f) & 1) == 0)) {
                  FlatVector::SetNull(local_128,idx,true);
                }
                *(int *)((long)local_f8 + idx * 4) = (int)uVar35;
                uVar35 = uVar35 + 1;
                idx = idx + 1;
                iVar19 = iVar19 - 1;
                uVar31 = local_130;
                iVar18 = local_68;
              } while (iVar19 != 0);
            }
            uVar30 = uVar30 + 1;
            iVar32 = iVar32 + iVar18;
            iVar19 = iVar18;
          } while (uVar30 < uVar31);
        }
        pVVar24 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                              *)&local_120);
        VectorOperations::Copy(pVVar24,local_128,(SelectionVector *)local_f8,local_130 * iVar18,0,0)
        ;
        _Var33._M_head_impl = local_100._M_head_impl;
        local_100._M_head_impl = (VectorArrayBuffer *)0x0;
        local_118 = (undefined1  [8])_Var33._M_head_impl;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<duckdb::VectorArrayBuffer*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),_Var33._M_head_impl
                  );
        _Var15._M_pi = a_Stack_110[0]._M_pi;
        auVar14 = local_118;
        _local_118 = (undefined1  [16])0x0;
        p_Var5 = (local_70->auxiliary).internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (local_70->auxiliary).internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)auVar14;
        (local_70->auxiliary).internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var15._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
          }
        }
        if (aLStack_f0[0].type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     aLStack_f0[0].type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        _Var33._M_head_impl = local_100._M_head_impl;
        if (local_120._M_head_impl != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&local_120,local_120._M_head_impl);
          _Var33._M_head_impl = local_100._M_head_impl;
        }
      }
      else {
        __s._M_head_impl = (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        iVar18 = local_130;
        if (__s._M_head_impl == (unsigned_long *)0x0) {
          local_118 = (undefined1  [8])
                      (this->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_f8,(unsigned_long *)local_118);
          this_01 = &(this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
          auVar14 = local_f8;
          uVar11 = aLStack_f0[0]._0_8_;
          _local_f8 = (undefined1  [16])0x0;
          p_Var5 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar14;
          (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_);
            }
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (this_01);
          iVar18 = local_130;
          __s._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask = __s._M_head_impl;
          if (__s._M_head_impl == (unsigned_long *)0x0) {
            local_118 = (undefined1  [8])
                        (this->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_f8,(unsigned_long *)local_118);
            auVar14 = local_f8;
            uVar11 = aLStack_f0[0]._0_8_;
            _local_f8 = (undefined1  [16])0x0;
            p_Var5 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)auVar14;
            (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_);
              }
            }
            pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (this_01);
            __s._M_head_impl =
                 (pTVar25->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask = __s._M_head_impl;
          }
        }
        if (iVar18 != 0) {
          uVar31 = iVar18 + 0x3f >> 6;
          if (uVar31 != 1) {
            switchD_01043a80::default(__s._M_head_impl,0,uVar31 * 8 - 8);
          }
          uVar26 = -1L << ((byte)iVar18 & 0x3f);
          if ((iVar18 & 0x3f) == 0) {
            uVar26 = 0;
          }
          __s._M_head_impl[uVar31 - 1] = uVar26;
        }
        if ((this->type).physical_type_ != STRUCT) goto LAB_00da3e81;
switchD_00da3c4b_caseD_18:
        make_uniq<duckdb::VectorStructBuffer>();
        local_128 = (type)unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                          ::operator->((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                                        *)local_118);
        pvVar27 = StructVector::GetEntries(this);
        this_02 = (pvVar27->
                  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = (pvVar27->
                  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (this_02 != puVar10) {
          local_128 = (type)&(local_128->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data;
          do {
            pVVar24 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(this_02);
            pVVar21 = (Vector *)operator_new(0x68);
            Vector(pVVar21,pVVar24);
            local_f8 = (undefined1  [8])pVVar21;
            pVVar23 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator->((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                                  *)local_f8);
            Flatten(pVVar23,local_130);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
                        *)local_128,
                       (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                       local_f8);
            if (local_f8 != (undefined1  [8])0x0) {
              ::std::default_delete<duckdb::Vector>::operator()
                        ((default_delete<duckdb::Vector> *)local_f8,(Vector *)local_f8);
            }
            this_02 = this_02 + 1;
          } while (this_02 != puVar10);
        }
        local_f8 = local_118;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = a_Stack_110[0]._M_pi;
        _local_118 = auVar13 << 0x40;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<duckdb::VectorStructBuffer*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8),
                   (VectorStructBuffer *)local_f8);
        uVar11 = aLStack_f0[0]._0_8_;
        auVar14 = local_f8;
        _local_f8 = (undefined1  [16])0x0;
        p_Var5 = (this->auxiliary).internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (this->auxiliary).internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)auVar14;
        (this->auxiliary).internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_);
          }
        }
        _Var33._M_head_impl = (VectorArrayBuffer *)local_118;
      }
      if ((__uniq_ptr_impl<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>_>
           )_Var33._M_head_impl !=
          (__uniq_ptr_impl<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>_>
           )0x0) {
        (**(code **)(*(long *)_Var33._M_head_impl + 8))();
      }
    }
    else if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
        if (local_130 != 0) {
          bVar16 = *pbVar7 & 1;
LAB_00da4818:
          switchD_01043a80::default(pdVar34,(uint)bVar16,local_130);
        }
        break;
      case UINT8:
      case INT8:
        if (local_130 != 0) {
          bVar16 = *pbVar7;
          goto LAB_00da4818;
        }
        break;
      case UINT16:
        if (local_130 != 0) {
          uVar2 = *(undefined2 *)pbVar7;
          lVar29 = local_130 - 1;
          auVar40._8_4_ = (int)lVar29;
          auVar40._0_8_ = lVar29;
          auVar40._12_4_ = (int)((ulong)lVar29 >> 0x20);
          uVar31 = 0;
          auVar40 = auVar40 ^ _DAT_01d84390;
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar48 = _DAT_01db3e70;
          auVar53 = _DAT_01db3e80;
          auVar57 = _DAT_01db3e50;
          auVar59 = _DAT_01d84380;
          do {
            auVar63 = auVar59 ^ auVar13;
            iVar87 = auVar40._0_4_;
            iVar86 = -(uint)(iVar87 < auVar63._0_4_);
            iVar43 = auVar40._4_4_;
            auVar72._4_4_ = -(uint)(iVar43 < auVar63._4_4_);
            iVar93 = auVar40._8_4_;
            iVar92 = -(uint)(iVar93 < auVar63._8_4_);
            iVar44 = auVar40._12_4_;
            auVar72._12_4_ = -(uint)(iVar44 < auVar63._12_4_);
            auVar82._4_4_ = iVar86;
            auVar82._0_4_ = iVar86;
            auVar82._8_4_ = iVar92;
            auVar82._12_4_ = iVar92;
            auVar51 = pshuflw(in_XMM11,auVar82,0xe8);
            auVar71._4_4_ = -(uint)(auVar63._4_4_ == iVar43);
            auVar71._12_4_ = -(uint)(auVar63._12_4_ == iVar44);
            auVar71._0_4_ = auVar71._4_4_;
            auVar71._8_4_ = auVar71._12_4_;
            auVar62 = pshuflw(in_XMM12,auVar71,0xe8);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar63 = pshuflw(auVar51,auVar72,0xe8);
            auVar63 = (auVar63 | auVar62 & auVar51) ^ auVar61;
            auVar63 = packssdw(auVar63,auVar63);
            if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2) = uVar2;
            }
            auVar72 = auVar71 & auVar82 | auVar72;
            auVar63 = packssdw(auVar72,auVar72);
            auVar63 = packssdw(auVar63 ^ auVar61,auVar63 ^ auVar61);
            if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 2) = uVar2;
            }
            auVar63 = auVar57 ^ auVar13;
            iVar86 = -(uint)(iVar87 < auVar63._0_4_);
            auVar90._4_4_ = -(uint)(iVar43 < auVar63._4_4_);
            iVar92 = -(uint)(iVar93 < auVar63._8_4_);
            auVar90._12_4_ = -(uint)(iVar44 < auVar63._12_4_);
            auVar73._4_4_ = iVar86;
            auVar73._0_4_ = iVar86;
            auVar73._8_4_ = iVar92;
            auVar73._12_4_ = iVar92;
            auVar83._4_4_ = -(uint)(auVar63._4_4_ == iVar43);
            auVar83._12_4_ = -(uint)(auVar63._12_4_ == iVar44);
            auVar83._0_4_ = auVar83._4_4_;
            auVar83._8_4_ = auVar83._12_4_;
            auVar90._0_4_ = auVar90._4_4_;
            auVar90._8_4_ = auVar90._12_4_;
            auVar63 = auVar83 & auVar73 | auVar90;
            auVar63 = packssdw(auVar63,auVar63);
            auVar63 = packssdw(auVar63 ^ auVar61,auVar63 ^ auVar61);
            if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 4) = uVar2;
            }
            auVar67 = pshufhw(auVar73,auVar73,0x84);
            auVar79 = pshufhw(auVar83,auVar83,0x84);
            auVar46 = pshufhw(auVar67,auVar90,0x84);
            auVar67 = (auVar46 | auVar79 & auVar67) ^ auVar61;
            auVar67 = packssdw(auVar67,auVar67);
            if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 6) = uVar2;
            }
            auVar67 = auVar53 ^ auVar13;
            iVar86 = -(uint)(iVar87 < auVar67._0_4_);
            auVar75._4_4_ = -(uint)(iVar43 < auVar67._4_4_);
            iVar92 = -(uint)(iVar93 < auVar67._8_4_);
            auVar75._12_4_ = -(uint)(iVar44 < auVar67._12_4_);
            auVar84._4_4_ = iVar86;
            auVar84._0_4_ = iVar86;
            auVar84._8_4_ = iVar92;
            auVar84._12_4_ = iVar92;
            auVar63 = pshuflw(auVar63,auVar84,0xe8);
            auVar74._4_4_ = -(uint)(auVar67._4_4_ == iVar43);
            auVar74._12_4_ = -(uint)(auVar67._12_4_ == iVar44);
            auVar74._0_4_ = auVar74._4_4_;
            auVar74._8_4_ = auVar74._12_4_;
            in_XMM12 = pshuflw(auVar62 & auVar51,auVar74,0xe8);
            in_XMM12 = in_XMM12 & auVar63;
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar63 = pshuflw(auVar63,auVar75,0xe8);
            auVar63 = (auVar63 | in_XMM12) ^ auVar61;
            auVar63 = packssdw(auVar63,auVar63);
            if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 8) = uVar2;
            }
            auVar75 = auVar74 & auVar84 | auVar75;
            auVar63 = packssdw(auVar75,auVar75);
            auVar63 = packssdw(auVar63 ^ auVar61,auVar63 ^ auVar61);
            if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 10) = uVar2;
            }
            auVar63 = auVar48 ^ auVar13;
            iVar87 = -(uint)(iVar87 < auVar63._0_4_);
            auVar91._4_4_ = -(uint)(iVar43 < auVar63._4_4_);
            iVar93 = -(uint)(iVar93 < auVar63._8_4_);
            auVar91._12_4_ = -(uint)(iVar44 < auVar63._12_4_);
            auVar76._4_4_ = iVar87;
            auVar76._0_4_ = iVar87;
            auVar76._8_4_ = iVar93;
            auVar76._12_4_ = iVar93;
            auVar85._4_4_ = -(uint)(auVar63._4_4_ == iVar43);
            auVar85._12_4_ = -(uint)(auVar63._12_4_ == iVar44);
            auVar85._0_4_ = auVar85._4_4_;
            auVar85._8_4_ = auVar85._12_4_;
            auVar91._0_4_ = auVar91._4_4_;
            auVar91._8_4_ = auVar91._12_4_;
            auVar63 = auVar85 & auVar76 | auVar91;
            auVar63 = packssdw(auVar63,auVar63);
            in_XMM11 = packssdw(auVar63 ^ auVar61,auVar63 ^ auVar61);
            if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 0xc) = uVar2;
            }
            auVar63 = pshufhw(auVar76,auVar76,0x84);
            auVar62 = pshufhw(auVar85,auVar85,0x84);
            auVar51 = pshufhw(auVar63,auVar91,0x84);
            auVar63 = (auVar51 | auVar62 & auVar63) ^ auVar61;
            auVar63 = packssdw(auVar63,auVar63);
            if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 0xe) = uVar2;
            }
            uVar31 = uVar31 + 8;
            lVar29 = auVar59._8_8_;
            auVar59._0_8_ = auVar59._0_8_ + 8;
            auVar59._8_8_ = lVar29 + 8;
            lVar29 = auVar57._8_8_;
            auVar57._0_8_ = auVar57._0_8_ + 8;
            auVar57._8_8_ = lVar29 + 8;
            lVar29 = auVar53._8_8_;
            auVar53._0_8_ = auVar53._0_8_ + 8;
            auVar53._8_8_ = lVar29 + 8;
            lVar29 = auVar48._8_8_;
            auVar48._0_8_ = auVar48._0_8_ + 8;
            auVar48._8_8_ = lVar29 + 8;
          } while ((local_130 + 7 & 0xfffffffffffffff8) != uVar31);
        }
        break;
      case INT16:
        if (local_130 != 0) {
          uVar2 = *(undefined2 *)pbVar7;
          lVar29 = local_130 - 1;
          auVar39._8_4_ = (int)lVar29;
          auVar39._0_8_ = lVar29;
          auVar39._12_4_ = (int)((ulong)lVar29 >> 0x20);
          uVar31 = 0;
          auVar39 = auVar39 ^ _DAT_01d84390;
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0xffffffffffffffff;
          auVar60._12_4_ = 0xffffffff;
          auVar47 = _DAT_01db3e70;
          auVar52 = _DAT_01db3e80;
          auVar56 = _DAT_01db3e50;
          auVar58 = _DAT_01d84380;
          do {
            auVar63 = auVar58 ^ auVar13;
            iVar87 = auVar39._0_4_;
            iVar86 = -(uint)(iVar87 < auVar63._0_4_);
            iVar43 = auVar39._4_4_;
            auVar65._4_4_ = -(uint)(iVar43 < auVar63._4_4_);
            iVar93 = auVar39._8_4_;
            iVar92 = -(uint)(iVar93 < auVar63._8_4_);
            iVar44 = auVar39._12_4_;
            auVar65._12_4_ = -(uint)(iVar44 < auVar63._12_4_);
            auVar77._4_4_ = iVar86;
            auVar77._0_4_ = iVar86;
            auVar77._8_4_ = iVar92;
            auVar77._12_4_ = iVar92;
            auVar51 = pshuflw(in_XMM11,auVar77,0xe8);
            auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar43);
            auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar44);
            auVar64._0_4_ = auVar64._4_4_;
            auVar64._8_4_ = auVar64._12_4_;
            auVar62 = pshuflw(in_XMM12,auVar64,0xe8);
            auVar65._0_4_ = auVar65._4_4_;
            auVar65._8_4_ = auVar65._12_4_;
            auVar63 = pshuflw(auVar51,auVar65,0xe8);
            auVar63 = (auVar63 | auVar62 & auVar51) ^ auVar60;
            auVar63 = packssdw(auVar63,auVar63);
            if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2) = uVar2;
            }
            auVar65 = auVar64 & auVar77 | auVar65;
            auVar63 = packssdw(auVar65,auVar65);
            auVar63 = packssdw(auVar63 ^ auVar60,auVar63 ^ auVar60);
            if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 2) = uVar2;
            }
            auVar63 = auVar56 ^ auVar13;
            iVar86 = -(uint)(iVar87 < auVar63._0_4_);
            auVar88._4_4_ = -(uint)(iVar43 < auVar63._4_4_);
            iVar92 = -(uint)(iVar93 < auVar63._8_4_);
            auVar88._12_4_ = -(uint)(iVar44 < auVar63._12_4_);
            auVar66._4_4_ = iVar86;
            auVar66._0_4_ = iVar86;
            auVar66._8_4_ = iVar92;
            auVar66._12_4_ = iVar92;
            auVar78._4_4_ = -(uint)(auVar63._4_4_ == iVar43);
            auVar78._12_4_ = -(uint)(auVar63._12_4_ == iVar44);
            auVar78._0_4_ = auVar78._4_4_;
            auVar78._8_4_ = auVar78._12_4_;
            auVar88._0_4_ = auVar88._4_4_;
            auVar88._8_4_ = auVar88._12_4_;
            auVar63 = auVar78 & auVar66 | auVar88;
            auVar63 = packssdw(auVar63,auVar63);
            auVar63 = packssdw(auVar63 ^ auVar60,auVar63 ^ auVar60);
            if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 4) = uVar2;
            }
            auVar67 = pshufhw(auVar66,auVar66,0x84);
            auVar79 = pshufhw(auVar78,auVar78,0x84);
            auVar46 = pshufhw(auVar67,auVar88,0x84);
            auVar67 = (auVar46 | auVar79 & auVar67) ^ auVar60;
            auVar67 = packssdw(auVar67,auVar67);
            if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 6) = uVar2;
            }
            auVar67 = auVar52 ^ auVar13;
            iVar86 = -(uint)(iVar87 < auVar67._0_4_);
            auVar69._4_4_ = -(uint)(iVar43 < auVar67._4_4_);
            iVar92 = -(uint)(iVar93 < auVar67._8_4_);
            auVar69._12_4_ = -(uint)(iVar44 < auVar67._12_4_);
            auVar80._4_4_ = iVar86;
            auVar80._0_4_ = iVar86;
            auVar80._8_4_ = iVar92;
            auVar80._12_4_ = iVar92;
            auVar63 = pshuflw(auVar63,auVar80,0xe8);
            auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar43);
            auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar44);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            in_XMM12 = pshuflw(auVar62 & auVar51,auVar68,0xe8);
            in_XMM12 = in_XMM12 & auVar63;
            auVar69._0_4_ = auVar69._4_4_;
            auVar69._8_4_ = auVar69._12_4_;
            auVar63 = pshuflw(auVar63,auVar69,0xe8);
            auVar63 = (auVar63 | in_XMM12) ^ auVar60;
            auVar63 = packssdw(auVar63,auVar63);
            if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 8) = uVar2;
            }
            auVar69 = auVar68 & auVar80 | auVar69;
            auVar63 = packssdw(auVar69,auVar69);
            auVar63 = packssdw(auVar63 ^ auVar60,auVar63 ^ auVar60);
            if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 10) = uVar2;
            }
            auVar63 = auVar47 ^ auVar13;
            iVar87 = -(uint)(iVar87 < auVar63._0_4_);
            auVar89._4_4_ = -(uint)(iVar43 < auVar63._4_4_);
            iVar93 = -(uint)(iVar93 < auVar63._8_4_);
            auVar89._12_4_ = -(uint)(iVar44 < auVar63._12_4_);
            auVar70._4_4_ = iVar87;
            auVar70._0_4_ = iVar87;
            auVar70._8_4_ = iVar93;
            auVar70._12_4_ = iVar93;
            auVar81._4_4_ = -(uint)(auVar63._4_4_ == iVar43);
            auVar81._12_4_ = -(uint)(auVar63._12_4_ == iVar44);
            auVar81._0_4_ = auVar81._4_4_;
            auVar81._8_4_ = auVar81._12_4_;
            auVar89._0_4_ = auVar89._4_4_;
            auVar89._8_4_ = auVar89._12_4_;
            auVar63 = auVar81 & auVar70 | auVar89;
            auVar63 = packssdw(auVar63,auVar63);
            in_XMM11 = packssdw(auVar63 ^ auVar60,auVar63 ^ auVar60);
            if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 0xc) = uVar2;
            }
            auVar63 = pshufhw(auVar70,auVar70,0x84);
            auVar62 = pshufhw(auVar81,auVar81,0x84);
            auVar51 = pshufhw(auVar63,auVar89,0x84);
            auVar63 = (auVar51 | auVar62 & auVar63) ^ auVar60;
            auVar63 = packssdw(auVar63,auVar63);
            if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar34 + uVar31 * 2 + 0xe) = uVar2;
            }
            uVar31 = uVar31 + 8;
            lVar29 = auVar58._8_8_;
            auVar58._0_8_ = auVar58._0_8_ + 8;
            auVar58._8_8_ = lVar29 + 8;
            lVar29 = auVar56._8_8_;
            auVar56._0_8_ = auVar56._0_8_ + 8;
            auVar56._8_8_ = lVar29 + 8;
            lVar29 = auVar52._8_8_;
            auVar52._0_8_ = auVar52._0_8_ + 8;
            auVar52._8_8_ = lVar29 + 8;
            lVar29 = auVar47._8_8_;
            auVar47._0_8_ = auVar47._0_8_ + 8;
            auVar47._8_8_ = lVar29 + 8;
          } while ((local_130 + 7 & 0xfffffffffffffff8) != uVar31);
        }
        break;
      case UINT32:
        if (local_130 != 0) {
          uVar3 = *(undefined4 *)pbVar7;
          lVar29 = local_130 - 1;
          auVar42._8_4_ = (int)lVar29;
          auVar42._0_8_ = lVar29;
          auVar42._12_4_ = (int)((ulong)lVar29 >> 0x20);
          uVar31 = 0;
          auVar42 = auVar42 ^ _DAT_01d84390;
          auVar50 = _DAT_01db3e50;
          auVar55 = _DAT_01d84380;
          do {
            auVar63 = auVar55 ^ auVar13;
            iVar87 = auVar42._4_4_;
            if ((bool)(~(auVar63._4_4_ == iVar87 && auVar42._0_4_ < auVar63._0_4_ ||
                        iVar87 < auVar63._4_4_) & 1)) {
              *(undefined4 *)(pdVar34 + uVar31 * 4) = uVar3;
            }
            if ((auVar63._12_4_ != auVar42._12_4_ || auVar63._8_4_ <= auVar42._8_4_) &&
                auVar63._12_4_ <= auVar42._12_4_) {
              *(undefined4 *)(pdVar34 + uVar31 * 4 + 4) = uVar3;
            }
            iVar43 = SUB164(auVar50 ^ auVar13,4);
            if (iVar43 <= iVar87 &&
                (iVar43 != iVar87 || SUB164(auVar50 ^ auVar13,0) <= auVar42._0_4_)) {
              *(undefined4 *)(pdVar34 + uVar31 * 4 + 8) = uVar3;
              *(undefined4 *)(pdVar34 + uVar31 * 4 + 0xc) = uVar3;
            }
            uVar31 = uVar31 + 4;
            lVar29 = auVar55._8_8_;
            auVar55._0_8_ = auVar55._0_8_ + 4;
            auVar55._8_8_ = lVar29 + 4;
            lVar29 = auVar50._8_8_;
            auVar50._0_8_ = auVar50._0_8_ + 4;
            auVar50._8_8_ = lVar29 + 4;
          } while ((local_130 + 3 & 0xfffffffffffffffc) != uVar31);
        }
        break;
      case INT32:
        if (local_130 != 0) {
          uVar3 = *(undefined4 *)pbVar7;
          lVar29 = local_130 - 1;
          auVar41._8_4_ = (int)lVar29;
          auVar41._0_8_ = lVar29;
          auVar41._12_4_ = (int)((ulong)lVar29 >> 0x20);
          uVar31 = 0;
          auVar41 = auVar41 ^ _DAT_01d84390;
          auVar49 = _DAT_01db3e50;
          auVar54 = _DAT_01d84380;
          do {
            auVar63 = auVar54 ^ auVar13;
            iVar87 = auVar41._4_4_;
            if ((bool)(~(auVar63._4_4_ == iVar87 && auVar41._0_4_ < auVar63._0_4_ ||
                        iVar87 < auVar63._4_4_) & 1)) {
              *(undefined4 *)(pdVar34 + uVar31 * 4) = uVar3;
            }
            if ((auVar63._12_4_ != auVar41._12_4_ || auVar63._8_4_ <= auVar41._8_4_) &&
                auVar63._12_4_ <= auVar41._12_4_) {
              *(undefined4 *)(pdVar34 + uVar31 * 4 + 4) = uVar3;
            }
            iVar43 = SUB164(auVar49 ^ auVar13,4);
            if (iVar43 <= iVar87 &&
                (iVar43 != iVar87 || SUB164(auVar49 ^ auVar13,0) <= auVar41._0_4_)) {
              *(undefined4 *)(pdVar34 + uVar31 * 4 + 8) = uVar3;
              *(undefined4 *)(pdVar34 + uVar31 * 4 + 0xc) = uVar3;
            }
            uVar31 = uVar31 + 4;
            lVar29 = auVar54._8_8_;
            auVar54._0_8_ = auVar54._0_8_ + 4;
            auVar54._8_8_ = lVar29 + 4;
            lVar29 = auVar49._8_8_;
            auVar49._0_8_ = auVar49._0_8_ + 4;
            auVar49._8_8_ = lVar29 + 4;
          } while ((local_130 + 3 & 0xfffffffffffffffc) != uVar31);
        }
        break;
      case UINT64:
        if (local_130 != 0) {
          uVar11 = *(undefined8 *)pbVar7;
          lVar29 = local_130 - 1;
          auVar37._8_4_ = (int)lVar29;
          auVar37._0_8_ = lVar29;
          auVar37._12_4_ = (int)((ulong)lVar29 >> 0x20);
          uVar31 = 0;
          auVar37 = auVar37 ^ _DAT_01d84390;
          auVar45 = _DAT_01d84380;
          do {
            auVar63 = auVar45 ^ auVar13;
            if ((bool)(~(auVar63._4_4_ == auVar37._4_4_ && auVar37._0_4_ < auVar63._0_4_ ||
                        auVar37._4_4_ < auVar63._4_4_) & 1)) {
              *(undefined8 *)(pdVar34 + uVar31 * 8) = uVar11;
            }
            if ((auVar63._12_4_ != auVar37._12_4_ || auVar63._8_4_ <= auVar37._8_4_) &&
                auVar63._12_4_ <= auVar37._12_4_) {
              *(undefined8 *)(pdVar34 + uVar31 * 8 + 8) = uVar11;
            }
            uVar31 = uVar31 + 2;
            lVar29 = auVar45._8_8_;
            auVar45._0_8_ = auVar45._0_8_ + 2;
            auVar45._8_8_ = lVar29 + 2;
          } while ((local_130 + 1 & 0xfffffffffffffffe) != uVar31);
        }
        break;
      case INT64:
        if (local_130 != 0) {
          uVar11 = *(undefined8 *)pbVar7;
          lVar29 = local_130 - 1;
          auVar38._8_4_ = (int)lVar29;
          auVar38._0_8_ = lVar29;
          auVar38._12_4_ = (int)((ulong)lVar29 >> 0x20);
          uVar31 = 0;
          auVar38 = auVar38 ^ _DAT_01d84390;
          auVar79 = _DAT_01d84380;
          do {
            auVar63 = auVar79 ^ auVar13;
            if ((bool)(~(auVar63._4_4_ == auVar38._4_4_ && auVar38._0_4_ < auVar63._0_4_ ||
                        auVar38._4_4_ < auVar63._4_4_) & 1)) {
              *(undefined8 *)(pdVar34 + uVar31 * 8) = uVar11;
            }
            if ((auVar63._12_4_ != auVar38._12_4_ || auVar63._8_4_ <= auVar38._8_4_) &&
                auVar63._12_4_ <= auVar38._12_4_) {
              *(undefined8 *)(pdVar34 + uVar31 * 8 + 8) = uVar11;
            }
            uVar31 = uVar31 + 2;
            lVar29 = auVar79._8_8_;
            auVar79._0_8_ = auVar79._0_8_ + 2;
            auVar79._8_8_ = lVar29 + 2;
          } while ((local_130 + 1 & 0xfffffffffffffffe) != uVar31);
        }
        break;
      default:
switchD_00da3c4b_caseD_a:
        pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
        local_f8 = (undefined1  [8])&aLStack_f0[0].type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,"Unimplemented type for VectorOperations::Flatten","");
        InternalException::InternalException(pIVar28,(string *)local_f8);
        __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        if (local_130 != 0) {
          uVar3 = *(undefined4 *)pbVar7;
          lVar29 = local_130 - 1;
          auVar46._8_4_ = (int)lVar29;
          auVar46._0_8_ = lVar29;
          auVar46._12_4_ = (int)((ulong)lVar29 >> 0x20);
          uVar31 = 0;
          auVar46 = auVar46 ^ _DAT_01d84390;
          auVar62 = _DAT_01db3e50;
          auVar67 = _DAT_01d84380;
          do {
            auVar63 = auVar67 ^ auVar13;
            iVar87 = auVar46._4_4_;
            if ((bool)(~(auVar63._4_4_ == iVar87 && auVar46._0_4_ < auVar63._0_4_ ||
                        iVar87 < auVar63._4_4_) & 1)) {
              *(undefined4 *)(pdVar34 + uVar31 * 4) = uVar3;
            }
            if ((auVar63._12_4_ != auVar46._12_4_ || auVar63._8_4_ <= auVar46._8_4_) &&
                auVar63._12_4_ <= auVar46._12_4_) {
              *(undefined4 *)(pdVar34 + uVar31 * 4 + 4) = uVar3;
            }
            iVar43 = SUB164(auVar62 ^ auVar13,4);
            if (iVar43 <= iVar87 &&
                (iVar43 != iVar87 || SUB164(auVar62 ^ auVar13,0) <= auVar46._0_4_)) {
              *(undefined4 *)(pdVar34 + uVar31 * 4 + 8) = uVar3;
              *(undefined4 *)(pdVar34 + uVar31 * 4 + 0xc) = uVar3;
            }
            uVar31 = uVar31 + 4;
            lVar29 = auVar67._8_8_;
            auVar67._0_8_ = auVar67._0_8_ + 4;
            auVar67._8_8_ = lVar29 + 4;
            lVar29 = auVar62._8_8_;
            auVar62._0_8_ = auVar62._0_8_ + 4;
            auVar62._8_8_ = lVar29 + 4;
          } while ((local_130 + 3 & 0xfffffffffffffffc) != uVar31);
        }
        break;
      case DOUBLE:
        if (local_130 != 0) {
          uVar11 = *(undefined8 *)pbVar7;
          lVar29 = local_130 - 1;
          auVar51._8_4_ = (int)lVar29;
          auVar51._0_8_ = lVar29;
          auVar51._12_4_ = (int)((ulong)lVar29 >> 0x20);
          uVar31 = 0;
          auVar51 = auVar51 ^ _DAT_01d84390;
          auVar63 = _DAT_01d84380;
          do {
            auVar62 = auVar63 ^ auVar13;
            if ((bool)(~(auVar62._4_4_ == auVar51._4_4_ && auVar51._0_4_ < auVar62._0_4_ ||
                        auVar51._4_4_ < auVar62._4_4_) & 1)) {
              *(undefined8 *)(pdVar34 + uVar31 * 8) = uVar11;
            }
            if ((auVar62._12_4_ != auVar51._12_4_ || auVar62._8_4_ <= auVar51._8_4_) &&
                auVar62._12_4_ <= auVar51._12_4_) {
              *(undefined8 *)(pdVar34 + uVar31 * 8 + 8) = uVar11;
            }
            uVar31 = uVar31 + 2;
            lVar29 = auVar63._8_8_;
            auVar63._0_8_ = auVar63._0_8_ + 2;
            auVar63._8_8_ = lVar29 + 2;
          } while ((local_130 + 1 & 0xfffffffffffffffe) != uVar31);
        }
        break;
      case INTERVAL:
        if (local_130 != 0) {
          uVar11 = *(undefined8 *)pbVar7;
          uVar12 = *(undefined8 *)(pbVar7 + 8);
          iVar18 = local_130;
          do {
            *(undefined8 *)pdVar34 = uVar11;
            *(undefined8 *)(pdVar34 + 8) = uVar12;
            pdVar34 = pdVar34 + 0x10;
            iVar18 = iVar18 - 1;
          } while (iVar18 != 0);
        }
        break;
      case LIST:
        if (local_130 != 0) {
          uVar11 = *(undefined8 *)pbVar7;
          uVar12 = *(undefined8 *)(pbVar7 + 8);
          iVar18 = local_130;
          do {
            *(undefined8 *)pdVar34 = uVar11;
            *(undefined8 *)(pdVar34 + 8) = uVar12;
            pdVar34 = pdVar34 + 0x10;
            iVar18 = iVar18 - 1;
          } while (iVar18 != 0);
        }
        break;
      case STRUCT:
        goto switchD_00da3c4b_caseD_18;
      case ARRAY:
        goto switchD_00da3c4b_caseD_1d;
      }
    }
    else if (PVar1 == VARCHAR) {
      if (local_130 != 0) {
        uVar11 = *(undefined8 *)pbVar7;
        uVar12 = *(undefined8 *)(pbVar7 + 8);
        pdVar34 = pdVar34 + 8;
        iVar18 = local_130;
        do {
          *(undefined8 *)(pdVar34 + -8) = uVar11;
          *(undefined8 *)pdVar34 = uVar12;
          pdVar34 = pdVar34 + 0x10;
          iVar18 = iVar18 - 1;
        } while (iVar18 != 0);
      }
    }
    else if (PVar1 == UINT128) {
      if (local_130 != 0) {
        uVar11 = *(undefined8 *)pbVar7;
        uVar12 = *(undefined8 *)(pbVar7 + 8);
        iVar18 = local_130;
        do {
          *(undefined8 *)pdVar34 = uVar11;
          *(undefined8 *)(pdVar34 + 8) = uVar12;
          pdVar34 = pdVar34 + 0x10;
          iVar18 = iVar18 - 1;
        } while (iVar18 != 0);
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_00da3c4b_caseD_a;
      if (local_130 != 0) {
        uVar11 = *(undefined8 *)pbVar7;
        uVar12 = *(undefined8 *)(pbVar7 + 8);
        iVar18 = local_130;
        do {
          *(undefined8 *)pdVar34 = uVar11;
          *(undefined8 *)(pdVar34 + 8) = uVar12;
          pdVar34 = pdVar34 + 0x10;
          iVar18 = iVar18 - 1;
        } while (iVar18 != 0);
      }
    }
LAB_00da3e81:
    if (local_88.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    break;
  case DICTIONARY_VECTOR:
    LogicalType::LogicalType(&local_60,&this->type);
    Vector((Vector *)local_f8,&local_60,local_130);
    LogicalType::~LogicalType(&local_60);
    VectorOperations::Copy(this,(Vector *)local_f8,local_130,0,0);
    Reference(this,(Vector *)local_f8);
LAB_00da38f9:
    if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
    }
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
    }
    if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)(local_f8 + 8));
    break;
  case SEQUENCE_VECTOR:
    pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    piVar4 = (int64_t *)(pVVar17->data).pointer;
    start = *piVar4;
    increment = piVar4[1];
    count_00 = NumericCastImpl<unsigned_long,_long,_false>::Convert(piVar4[2]);
    uVar26 = 0x800;
    if (0x800 < count_00) {
      uVar26 = count_00;
    }
    iVar18 = GetTypeIdSize((this->type).physical_type_);
    local_88.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(iVar18 * uVar26);
    make_buffer<duckdb::VectorBuffer,unsigned_long>((duckdb *)local_f8,(unsigned_long *)&local_88);
    auVar14 = local_f8;
    uVar11 = aLStack_f0[0]._0_8_;
    _local_f8 = (undefined1  [16])0x0;
    p_Var5 = (this->buffer).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)auVar14;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_);
      }
    }
    pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    this->data = (pVVar17->data).pointer;
    VectorOperations::GenerateSequence(this,count_00,start,increment);
    break;
  default:
    pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
    local_f8 = (undefined1  [8])&aLStack_f0[0].type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Unimplemented type for normalify","");
    InternalException::InternalException(pIVar28,(string *)local_f8);
    __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Vector::Flatten(idx_t count) {
	switch (GetVectorType()) {
	case VectorType::FLAT_VECTOR:
		// already a flat vector
		break;
	case VectorType::FSST_VECTOR: {
		// Even though count may only be a part of the vector, we need to flatten the whole thing due to the way
		// ToUnifiedFormat uses flatten
		idx_t total_count = FSSTVector::GetCount(*this);
		// create vector to decompress into
		Vector other(GetType(), total_count);
		// now copy the data of this vector to the other vector, decompressing the strings in the process
		VectorOperations::Copy(*this, other, total_count, 0, 0);
		// create a reference to the data in the other vector
		this->Reference(other);
		break;
	}
	case VectorType::DICTIONARY_VECTOR: {
		// create a new flat vector of this type
		Vector other(GetType(), count);
		// now copy the data of this vector to the other vector, removing the selection vector in the process
		VectorOperations::Copy(*this, other, count, 0, 0);
		// create a reference to the data in the other vector
		this->Reference(other);
		break;
	}
	case VectorType::CONSTANT_VECTOR: {
		bool is_null = ConstantVector::IsNull(*this);
		// allocate a new buffer for the vector
		auto old_buffer = std::move(buffer);
		auto old_data = data;
		buffer = VectorBuffer::CreateStandardVector(type, MaxValue<idx_t>(STANDARD_VECTOR_SIZE, count));
		if (old_buffer) {
			D_ASSERT(buffer->GetAuxiliaryData() == nullptr);
			// The old buffer might be relying on the auxiliary data, keep it alive
			buffer->MoveAuxiliaryData(*old_buffer);
		}
		data = buffer->GetData();
		vector_type = VectorType::FLAT_VECTOR;
		if (is_null && GetType().InternalType() != PhysicalType::ARRAY) {
			// constant NULL, set nullmask
			validity.EnsureWritable();
			validity.SetAllInvalid(count);
			if (GetType().InternalType() != PhysicalType::STRUCT) {
				// for structs we still need to flatten the child vectors as well
				return;
			}
		}
		// non-null constant: have to repeat the constant
		switch (GetType().InternalType()) {
		case PhysicalType::BOOL:
			TemplatedFlattenConstantVector<bool>(data, old_data, count);
			break;
		case PhysicalType::INT8:
			TemplatedFlattenConstantVector<int8_t>(data, old_data, count);
			break;
		case PhysicalType::INT16:
			TemplatedFlattenConstantVector<int16_t>(data, old_data, count);
			break;
		case PhysicalType::INT32:
			TemplatedFlattenConstantVector<int32_t>(data, old_data, count);
			break;
		case PhysicalType::INT64:
			TemplatedFlattenConstantVector<int64_t>(data, old_data, count);
			break;
		case PhysicalType::UINT8:
			TemplatedFlattenConstantVector<uint8_t>(data, old_data, count);
			break;
		case PhysicalType::UINT16:
			TemplatedFlattenConstantVector<uint16_t>(data, old_data, count);
			break;
		case PhysicalType::UINT32:
			TemplatedFlattenConstantVector<uint32_t>(data, old_data, count);
			break;
		case PhysicalType::UINT64:
			TemplatedFlattenConstantVector<uint64_t>(data, old_data, count);
			break;
		case PhysicalType::INT128:
			TemplatedFlattenConstantVector<hugeint_t>(data, old_data, count);
			break;
		case PhysicalType::UINT128:
			TemplatedFlattenConstantVector<uhugeint_t>(data, old_data, count);
			break;
		case PhysicalType::FLOAT:
			TemplatedFlattenConstantVector<float>(data, old_data, count);
			break;
		case PhysicalType::DOUBLE:
			TemplatedFlattenConstantVector<double>(data, old_data, count);
			break;
		case PhysicalType::INTERVAL:
			TemplatedFlattenConstantVector<interval_t>(data, old_data, count);
			break;
		case PhysicalType::VARCHAR:
			TemplatedFlattenConstantVector<string_t>(data, old_data, count);
			break;
		case PhysicalType::LIST: {
			TemplatedFlattenConstantVector<list_entry_t>(data, old_data, count);
			break;
		}
		case PhysicalType::ARRAY: {
			auto &original_child = ArrayVector::GetEntry(*this);
			auto array_size = ArrayType::GetSize(GetType());
			auto flattened_buffer = make_uniq<VectorArrayBuffer>(GetType(), count);
			auto &new_child = flattened_buffer->GetChild();

			// Fast path: The array is a constant null
			if (is_null) {
				// Invalidate the parent array
				validity.SetAllInvalid(count);
				// Also invalidate the new child array
				new_child.validity.SetAllInvalid(count * array_size);
				// Recurse
				new_child.Flatten(count * array_size);
				// TODO: the fast path should exit here, but the part below it is somehow required for correctness
				// Attach the flattened buffer and return
				// auxiliary = shared_ptr<VectorBuffer>(flattened_buffer.release());
				// return;
			}

			// Now we need to "unpack" the child vector.
			// Basically, do this:
			//
			// | a1 | | 1 |      | a1 | | 1 |
			//        | 2 |      | a2 | | 2 |
			//	             =>    ..   | 1 |
			//                          | 2 |
			// 							 ...

			auto child_vec = make_uniq<Vector>(original_child);
			child_vec->Flatten(count * array_size);

			// Create a selection vector
			SelectionVector sel(count * array_size);
			for (idx_t array_idx = 0; array_idx < count; array_idx++) {
				for (idx_t elem_idx = 0; elem_idx < array_size; elem_idx++) {
					auto position = array_idx * array_size + elem_idx;
					// Broadcast the validity
					if (FlatVector::IsNull(*child_vec, elem_idx)) {
						FlatVector::SetNull(new_child, position, true);
					}
					sel.set_index(position, elem_idx);
				}
			}

			// Copy over the data to the new buffer
			VectorOperations::Copy(*child_vec, new_child, sel, count * array_size, 0, 0);
			auxiliary = shared_ptr<VectorBuffer>(flattened_buffer.release());

			break;
		}
		case PhysicalType::STRUCT: {
			auto normalified_buffer = make_uniq<VectorStructBuffer>();

			auto &new_children = normalified_buffer->GetChildren();

			auto &child_entries = StructVector::GetEntries(*this);
			for (auto &child : child_entries) {
				D_ASSERT(child->GetVectorType() == VectorType::CONSTANT_VECTOR);
				auto vector = make_uniq<Vector>(*child);
				vector->Flatten(count);
				new_children.push_back(std::move(vector));
			}
			auxiliary = shared_ptr<VectorBuffer>(normalified_buffer.release());
			break;
		}
		default:
			throw InternalException("Unimplemented type for VectorOperations::Flatten");
		}
		break;
	}
	case VectorType::SEQUENCE_VECTOR: {
		int64_t start, increment, sequence_count;
		SequenceVector::GetSequence(*this, start, increment, sequence_count);
		auto seq_count = NumericCast<idx_t>(sequence_count);

		buffer = VectorBuffer::CreateStandardVector(GetType(), MaxValue<idx_t>(STANDARD_VECTOR_SIZE, seq_count));
		data = buffer->GetData();
		VectorOperations::GenerateSequence(*this, seq_count, start, increment);
		break;
	}
	default:
		throw InternalException("Unimplemented type for normalify");
	}
}